

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  string *psVar3;
  cmValue local_c0;
  cmValue rule;
  string local_98;
  undefined1 local_78 [8];
  string ruleVar;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *linkRuleVar_local;
  cmMakefileTargetGenerator *this_local;
  string *linkRule;
  
  local_21 = 0;
  local_20 = linkRuleVar;
  linkRuleVar_local = (string *)this;
  this_local = (cmMakefileTargetGenerator *)__return_storage_ptr__;
  psVar3 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&local_48,this);
  bVar2 = cmGeneratorTarget::HasImplibGNUtoMS(pcVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar2) {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_((string *)&rule,this);
    cmGeneratorTarget::GetLinkerLanguage(&local_98,pcVar1,(string *)&rule);
    cmStrCat<char_const(&)[7],std::__cxx11::string,char_const(&)[14]>
              ((string *)local_78,(char (*) [7])0xff3e8d,&local_98,(char (*) [14])"_GNUtoMS_RULE");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&rule);
    local_c0 = cmMakefile::GetDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_78);
    bVar2 = cmValue::operator_cast_to_bool(&local_c0);
    if (bVar2) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_c0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar3);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->GetConfigName())) {
    std::string ruleVar =
      cmStrCat("CMAKE_",
               this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName()),
               "_GNUtoMS_RULE");
    if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += *rule;
    }
  }
  return linkRule;
}